

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

MemberInfo * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
          (Arena *this,MemberInfo *params,uint *params_1,Reader *params_2,
          NodeSourceInfoBuilderPair *params_3,bool *params_4)

{
  bool isInUnion;
  uint codeOrder;
  MemberInfo *this_00;
  long lVar1;
  undefined8 *puVar2;
  byte bVar3;
  NodeSourceInfoBuilderPair in_stack_ffffffffffffff78;
  
  bVar3 = 0;
  this_00 = (MemberInfo *)allocateBytes(this,0x1a0,8,true);
  codeOrder = *params_1;
  isInUnion = *params_4;
  puVar2 = (undefined8 *)&stack0xffffffffffffff78;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar2 = (params_3->node)._builder.segment;
    params_3 = (NodeSourceInfoBuilderPair *)((long)params_3 + (ulong)bVar3 * -0x10 + 8);
    puVar2 = puVar2 + (ulong)bVar3 * -2 + 1;
  }
  capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
            (this_00,params,codeOrder,params_2,in_stack_ffffffffffffff78,isInUnion);
  setDestructor(this,this_00,
                destroyObject<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo>);
  return this_00;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}